

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall CLI::App::_parse_single_config(App *this,ConfigItem *item,size_t level)

{
  string *__rhs;
  pointer *pppAVar1;
  pointer pcVar2;
  iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  element_type *peVar4;
  pointer pbVar5;
  pointer ppVar6;
  pointer ppVar7;
  bool bVar8;
  type_conflict tVar9;
  int iVar10;
  App *pAVar11;
  Option *this_00;
  Option *pOVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  int64_t iVar13;
  InvalidError *this_01;
  int *piVar14;
  ConfigError *__return_storage_ptr__;
  ArgumentMismatch *__return_storage_ptr___00;
  ConversionError *__return_storage_ptr___01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  pointer pbVar15;
  _Alloc_hider _Var16;
  pointer ppVar17;
  pointer *ppbVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  results_t *prVar19;
  bool bVar20;
  string res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buffer;
  string local_2b8;
  pointer local_298;
  results_t *local_290;
  undefined1 local_288 [24];
  string local_270;
  pointer local_250;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pbVar15 = (item->parents).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (level < (ulong)((long)(item->parents).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15 >> 5)) {
    _Var16._M_p = pbVar15[level]._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,_Var16._M_p,_Var16._M_p + pbVar15[level]._M_string_length);
    pAVar11 = _find_subcommand(this,&local_50,false,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (pAVar11 == (App *)0x0) {
      return false;
    }
    bVar8 = _parse_single_config(pAVar11,item,level + 1);
    return bVar8;
  }
  __rhs = &item->name;
  iVar10 = ::std::__cxx11::string::compare((char *)__rhs);
  if (iVar10 == 0) {
    if (this->configurable_ != true) {
      return true;
    }
    increment_parsed(this);
    _trigger_pre_parse(this,2);
    pAVar11 = this->parent_;
    if (pAVar11 == (App *)0x0) {
      return true;
    }
    __position._M_current =
         (pAVar11->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (pAVar11->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      *__position._M_current = this;
      pppAVar1 = &(pAVar11->parsed_subcommands_).
                  super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppAVar1 = *pppAVar1 + 1;
      return true;
    }
    local_2b8._M_dataplus._M_p = (pointer)this;
    ::std::vector<CLI::App*,std::allocator<CLI::App*>>::_M_realloc_insert<CLI::App*>
              ((vector<CLI::App*,std::allocator<CLI::App*>> *)&pAVar11->parsed_subcommands_,
               __position,(App **)&local_2b8);
    return true;
  }
  iVar10 = ::std::__cxx11::string::compare((char *)__rhs);
  if (iVar10 == 0) {
    if (this->configurable_ != true) {
      return true;
    }
    if ((this->parse_complete_callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
      return true;
    }
    _process_callbacks(this);
    _process_requirements(this);
    run_callback(this,false,false);
    return true;
  }
  ::std::operator+(&local_70,"--",__rhs);
  this_00 = get_option_no_throw(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (this_00 == (Option *)0x0) {
    if ((item->name)._M_string_length == 1) {
      ::std::operator+(&local_90,"-",__rhs);
      this_00 = get_option_no_throw(this,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      this_00 = (Option *)0x0;
    }
    if (this_00 == (Option *)0x0) {
      pcVar2 = (item->name)._M_dataplus._M_p;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar2,pcVar2 + (item->name)._M_string_length);
      this_00 = get_option_no_throw(this,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    else if ((this_00->super_OptionBase<CLI::Option>).configurable_ == false) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      pcVar2 = (item->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar2,pcVar2 + (item->name)._M_string_length);
      pOVar12 = get_option_no_throw(this,&local_f0);
      _Var16._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) goto LAB_0014cc43;
      goto LAB_0014cc4b;
    }
  }
  else if ((this_00->super_OptionBase<CLI::Option>).configurable_ == false) {
    if ((item->name)._M_string_length == 1) {
      ::std::operator+(&local_d0,"-",__rhs);
      pOVar12 = get_option_no_throw(this,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((pOVar12 != (Option *)0x0) &&
         ((pOVar12->super_OptionBase<CLI::Option>).configurable_ != false)) {
        this_00 = pOVar12;
      }
    }
    if ((this_00->super_OptionBase<CLI::Option>).configurable_ == false) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      pcVar2 = (item->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar2,pcVar2 + (item->name)._M_string_length);
      pOVar12 = get_option_no_throw(this,&local_110);
      local_f0.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
      _Var16._M_p = local_110._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
LAB_0014cc43:
        operator_delete(_Var16._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
LAB_0014cc4b:
      if ((pOVar12 != (Option *)0x0) &&
         ((pOVar12->super_OptionBase<CLI::Option>).configurable_ != false)) {
        this_00 = pOVar12;
      }
    }
  }
  if (this_00 == (Option *)0x0) {
    if (this->allow_config_extras_ == capture) {
      local_270._M_dataplus._M_p._0_4_ = 0;
      ConfigItem::fullname_abi_cxx11_(&local_2b8,item);
      ::std::
      vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
      ::emplace_back<CLI::detail::Classifier,std::__cxx11::string>
                ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                  *)&this->missing_,(Classifier *)(local_288 + 0x18),&local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      __args_1 = (item->inputs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (item->inputs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__args_1 != pbVar3) {
        do {
          local_2b8._M_dataplus._M_p = local_2b8._M_dataplus._M_p & 0xffffffff00000000;
          ::std::
          vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
          ::emplace_back<CLI::detail::Classifier,std::__cxx11::string_const&>
                    ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                      *)&this->missing_,(Classifier *)&local_2b8,__args_1);
          __args_1 = __args_1 + 1;
        } while (__args_1 != pbVar3);
        return false;
      }
    }
    return false;
  }
  if ((this_00->super_OptionBase<CLI::Option>).configurable_ == false) {
    if (this->allow_config_extras_ == ignore_all) {
      return false;
    }
    __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
    ConfigItem::fullname_abi_cxx11_(&local_130,item);
    ConfigError::NotConfigurable(__return_storage_ptr__,&local_130);
    __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,Error::~Error);
  }
  if ((this_00->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this_00->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return true;
  }
  local_288._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_288._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_288._16_8_ = (pointer)0x0;
  if ((item->multiline == true) && (this_00->inject_separator_ == false)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_288,&item->inputs);
    __first = ::std::
              __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[3]>>
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_288._0_8_,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_288._8_8_,(_Iter_equals_val<const_char[3]>)0x170989);
    bVar8 = true;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_288,(iterator)__first._M_current,(iterator)local_288._8_8_);
  }
  else {
    bVar8 = false;
  }
  local_290 = &this_00->results_;
  pbVar15 = (pointer)local_288;
  if (!bVar8) {
    pbVar15 = (pointer)&item->inputs;
  }
  if (this_00->expected_min_ == 0) {
    if ((ulong)((long)(item->inputs).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(item->inputs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      peVar4 = (this->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar4->_vptr_Config[2])(&local_2b8,peVar4,item);
      if ((this_00->super_OptionBase<CLI::Option>).disable_flag_override_ == true) {
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,local_2b8._M_dataplus._M_p,
                   local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
        iVar13 = detail::to_flag_value(&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if (iVar13 != 1) goto LAB_0014d1e9;
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"{}","");
        Option::get_flag_value((string *)(local_288 + 0x18),this_00,__rhs,&local_1e8);
        ::std::__cxx11::string::operator=((string *)&local_2b8,(string *)(local_288 + 0x18));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_270._M_dataplus._M_p._4_4_,local_270._M_dataplus._M_p._0_4_) !=
            &local_270.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_270._M_dataplus._M_p._4_4_,local_270._M_dataplus._M_p._0_4_
                                  ),local_270.field_2._M_allocated_capacity + 1);
        }
        local_208.field_2._M_allocated_capacity = local_1e8.field_2._M_allocated_capacity;
        _Var16._M_p = local_1e8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
LAB_0014d290:
          operator_delete(_Var16._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
      }
      else {
LAB_0014d1e9:
        piVar14 = __errno_location();
        *piVar14 = 0;
        iVar10 = ::std::__cxx11::string::compare((char *)&local_2b8);
        if ((iVar10 != 0) || (this_00->expected_max_ < 2)) {
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,local_2b8._M_dataplus._M_p,
                     local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
          Option::get_flag_value((string *)(local_288 + 0x18),this_00,__rhs,&local_208);
          ::std::__cxx11::string::operator=((string *)&local_2b8,(string *)(local_288 + 0x18));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_270._M_dataplus._M_p._4_4_,local_270._M_dataplus._M_p._0_4_) !=
              &local_270.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_270._M_dataplus._M_p._4_4_,
                                     local_270._M_dataplus._M_p._0_4_),
                            local_270.field_2._M_allocated_capacity + 1);
          }
          _Var16._M_p = local_208._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) goto LAB_0014d290;
        }
      }
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,local_2b8._M_dataplus._M_p,
                 local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
      Option::_add_result(this_00,&local_228,local_290);
      this_00->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0014ce6c;
    }
    ppbVar18 = (pointer *)(local_288 + 8);
    if (!bVar8) {
      ppbVar18 = &(item->inputs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    }
    pbVar5 = *ppbVar18;
    pcVar2 = (pbVar15->_M_dataplus)._M_p;
    local_2b8._M_dataplus._M_p._0_4_ = this_00->type_size_max_;
    local_298 = pbVar15;
    tVar9 = detail::checked_multiply<int>((int *)&local_2b8,this_00->expected_max_);
    iVar10 = 0x20000000;
    if (tVar9) {
      iVar10 = (int)local_2b8._M_dataplus._M_p;
    }
    pbVar15 = local_298;
    if ((iVar10 < (int)((ulong)((long)pbVar5 - (long)pcVar2) >> 5)) &&
       ((this_00->super_OptionBase<CLI::Option>).multi_option_policy_ != TakeAll)) {
      local_2b8._M_dataplus._M_p._0_4_ = this_00->type_size_max_;
      tVar9 = detail::checked_multiply<int>((int *)&local_2b8,this_00->expected_max_);
      if (!tVar9 || 1 < (int)local_2b8._M_dataplus._M_p) {
        __return_storage_ptr___00 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        ConfigItem::fullname_abi_cxx11_(&local_170,item);
        local_2b8._M_dataplus._M_p._0_4_ = this_00->type_size_max_;
        tVar9 = detail::checked_multiply<int>((int *)&local_2b8,this_00->expected_max_);
        iVar10 = 0x20000000;
        if (tVar9) {
          iVar10 = (int)local_2b8._M_dataplus._M_p;
        }
        ArgumentMismatch::AtMost
                  (__return_storage_ptr___00,&local_170,iVar10,
                   (long)*ppbVar18 -
                   (long)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_298->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start >>
                   5);
        __cxa_throw(__return_storage_ptr___00,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      if ((this_00->super_OptionBase<CLI::Option>).disable_flag_override_ == false) {
        __return_storage_ptr___01 = (ConversionError *)__cxa_allocate_exception(0x38);
        ConfigItem::fullname_abi_cxx11_(&local_190,item);
        ConversionError::TooManyInputsFlag(__return_storage_ptr___01,&local_190);
        __cxa_throw(__return_storage_ptr___01,&ConversionError::typeinfo,Error::~Error);
      }
      pbVar15 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_298->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
      local_250 = *ppbVar18;
      prVar19 = local_290;
      if (pbVar15 != local_250) {
        do {
          ppVar6 = (this_00->default_flag_values_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar7 = (this_00->default_flag_values_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (ppVar6 == ppVar7) {
            iVar10 = ::std::__cxx11::string::compare((char *)pbVar15);
            if ((((iVar10 != 0) &&
                 (iVar10 = ::std::__cxx11::string::compare((char *)pbVar15), iVar10 != 0)) &&
                (iVar10 = ::std::__cxx11::string::compare((char *)pbVar15), iVar10 != 0)) &&
               (iVar10 = ::std::__cxx11::string::compare((char *)pbVar15), iVar10 != 0))
            goto LAB_0014d185;
          }
          else {
            pbVar5 = (pointer)pbVar15->_M_string_length;
            bVar8 = false;
            local_298 = pbVar15;
            do {
              ppVar17 = ppVar6 + 1;
              pbVar15 = (pointer)(ppVar6->second)._M_string_length;
              if (pbVar15 == pbVar5) {
                if (pbVar15 == (pointer)0x0) {
                  bVar20 = true;
                }
                else {
                  iVar10 = bcmp((ppVar6->second)._M_dataplus._M_p,
                                (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_298->_M_dataplus)->_M_impl).super__Vector_impl_data.
                                _M_start,(size_t)pbVar15);
                  bVar20 = iVar10 == 0;
                }
              }
              else {
                bVar20 = false;
              }
              if (bVar20) {
                bVar8 = true;
                break;
              }
              ppVar6 = ppVar17;
            } while (ppVar17 != ppVar7);
            pbVar15 = local_298;
            prVar19 = local_290;
            if (!bVar8) {
LAB_0014d185:
              this_01 = (InvalidError *)__cxa_allocate_exception(0x38);
              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1b0,"invalid flag argument given","");
              InvalidError::InvalidError(this_01,&local_1b0);
              __cxa_throw(this_01,&InvalidError::typeinfo,Error::~Error);
            }
          }
          pbVar5 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&pbVar15->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_248,pbVar5,
                     (long)&(((pointer)pbVar15->_M_string_length)->_M_dataplus)._M_p + (long)pbVar5)
          ;
          Option::_add_result(this_00,&local_248,prVar19);
          this_00->current_option_state_ = parsing;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
          pbVar15 = pbVar15 + 1;
        } while (pbVar15 != local_250);
      }
      goto LAB_0014ce6c;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1c8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)pbVar15);
  prVar19 = local_290;
  this_00->current_option_state_ = parsing;
  for (; local_1c8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_1c8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    Option::_add_result(this_00,local_1c8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,prVar19);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  Option::run_callback(this_00);
LAB_0014ce6c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_288);
  return true;
}

Assistant:

CLI11_INLINE bool App::_parse_single_config(const ConfigItem &item, std::size_t level) {

    if(level < item.parents.size()) {
        auto *subcom = get_subcommand_no_throw(item.parents.at(level));
        return (subcom != nullptr) ? subcom->_parse_single_config(item, level + 1) : false;
    }
    // check for section open
    if(item.name == "++") {
        if(configurable_) {
            increment_parsed();
            _trigger_pre_parse(2);
            if(parent_ != nullptr) {
                parent_->parsed_subcommands_.push_back(this);
            }
        }
        return true;
    }
    // check for section close
    if(item.name == "--") {
        if(configurable_ && parse_complete_callback_) {
            _process_callbacks();
            _process_requirements();
            run_callback();
        }
        return true;
    }
    Option *op = get_option_no_throw("--" + item.name);
    if(op == nullptr) {
        if(item.name.size() == 1) {
            op = get_option_no_throw("-" + item.name);
        }
        if(op == nullptr) {
            op = get_option_no_throw(item.name);
        } else if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    } else if(!op->get_configurable()) {
        if(item.name.size() == 1) {
            auto *testop = get_option_no_throw("-" + item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
        if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    }

    if(op == nullptr) {
        // If the option was not present
        if(get_allow_config_extras() == config_extras_mode::capture) {
            // Should we worry about classifying the extras properly?
            missing_.emplace_back(detail::Classifier::NONE, item.fullname());
            for(const auto &input : item.inputs) {
                missing_.emplace_back(detail::Classifier::NONE, input);
            }
        }
        return false;
    }

    if(!op->get_configurable()) {
        if(get_allow_config_extras() == config_extras_mode::ignore_all) {
            return false;
        }
        throw ConfigError::NotConfigurable(item.fullname());
    }
    if(op->empty()) {
        std::vector<std::string> buffer;  // a buffer to use for copying an modifying inputs in a few cases
        bool useBuffer{false};
        if(item.multiline) {
            if(!op->get_inject_separator()) {
                buffer = item.inputs;
                buffer.erase(std::remove(buffer.begin(), buffer.end(), "%%"), buffer.end());
                useBuffer = true;
            }
        }
        const std::vector<std::string> &inputs = (useBuffer) ? buffer : item.inputs;
        if(op->get_expected_min() == 0) {
            if(item.inputs.size() <= 1) {
                // Flag parsing
                auto res = config_formatter_->to_flag(item);
                bool converted{false};
                if(op->get_disable_flag_override()) {
                    auto val = detail::to_flag_value(res);
                    if(val == 1) {
                        res = op->get_flag_value(item.name, "{}");
                        converted = true;
                    }
                }

                if(!converted) {
                    errno = 0;
                    if(res != "{}" || op->get_expected_max() <= 1) {
                        res = op->get_flag_value(item.name, res);
                    }
                }

                op->add_result(res);
                return true;
            }
            if(static_cast<int>(inputs.size()) > op->get_items_expected_max() &&
               op->get_multi_option_policy() != MultiOptionPolicy::TakeAll) {
                if(op->get_items_expected_max() > 1) {
                    throw ArgumentMismatch::AtMost(item.fullname(), op->get_items_expected_max(), inputs.size());
                }

                if(!op->get_disable_flag_override()) {
                    throw ConversionError::TooManyInputsFlag(item.fullname());
                }
                // if the disable flag override is set then we must have the flag values match a known flag value
                // this is true regardless of the output value, so an array input is possible and must be accounted for
                for(const auto &res : inputs) {
                    bool valid_value{false};
                    if(op->default_flag_values_.empty()) {
                        if(res == "true" || res == "false" || res == "1" || res == "0") {
                            valid_value = true;
                        }
                    } else {
                        for(const auto &valid_res : op->default_flag_values_) {
                            if(valid_res.second == res) {
                                valid_value = true;
                                break;
                            }
                        }
                    }

                    if(valid_value) {
                        op->add_result(res);
                    } else {
                        throw InvalidError("invalid flag argument given");
                    }
                }
                return true;
            }
        }
        op->add_result(inputs);
        op->run_callback();
    }

    return true;
}